

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O3

Point3f __thiscall pbrt::AnimatedTransform::operator()(AnimatedTransform *this,Point3f p,Float time)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  float x;
  Point3f PVar13;
  Point3f PVar14;
  Transform t;
  Transform local_88;
  
  auVar12._4_60_ = p._12_60_;
  auVar12._0_4_ = p.super_Tuple3<pbrt::Point3,_float>.z;
  auVar10._8_56_ = p._8_56_;
  auVar10._0_8_ = p.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar9 = auVar10._0_16_;
  auVar11 = auVar12._0_16_;
  if ((this->actuallyAnimated != true) || (time <= this->startTime)) {
    auVar4 = vmovshdup_avx(auVar9);
    fVar8 = auVar4._0_4_;
    auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * (this->startTransform).m.m[3][1])),auVar9,
                             ZEXT416((uint)(this->startTransform).m.m[3][0]));
    auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * (this->startTransform).m.m[0][1])),auVar9,
                             ZEXT416((uint)(this->startTransform).m.m[0][0]));
    auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * (this->startTransform).m.m[1][1])),auVar9,
                             ZEXT416((uint)(this->startTransform).m.m[1][0]));
    auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * (this->startTransform).m.m[2][1])),auVar9,
                             ZEXT416((uint)(this->startTransform).m.m[2][0]));
    auVar4 = vfmadd231ss_fma(auVar4,auVar11,ZEXT416((uint)(this->startTransform).m.m[3][2]));
    auVar5 = vfmadd231ss_fma(auVar5,auVar11,ZEXT416((uint)(this->startTransform).m.m[0][2]));
    auVar6 = vfmadd231ss_fma(auVar6,auVar11,ZEXT416((uint)(this->startTransform).m.m[1][2]));
    auVar9 = vfmadd231ss_fma(auVar9,auVar11,ZEXT416((uint)(this->startTransform).m.m[2][2]));
    fVar8 = auVar4._0_4_ + (this->startTransform).m.m[3][3];
    fVar2 = auVar5._0_4_ + (this->startTransform).m.m[0][3];
    fVar7 = auVar6._0_4_ + (this->startTransform).m.m[1][3];
    fVar3 = auVar9._0_4_ + (this->startTransform).m.m[2][3];
  }
  else {
    if (time < this->endTime) {
      Interpolate(&local_88,this,time);
      auVar11 = vmovshdup_avx(auVar9);
      fVar7 = auVar11._0_4_;
      auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * local_88.m.m[0][1])),auVar9,
                                ZEXT416((uint)local_88.m.m[0][0]));
      auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)auVar12._0_4_),
                                ZEXT416((uint)local_88.m.m[0][2]));
      fVar8 = auVar11._0_4_ + local_88.m.m[0][3];
      auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * local_88.m.m[1][1])),auVar9,
                                ZEXT416((uint)local_88.m.m[1][0]));
      auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)auVar12._0_4_),
                                ZEXT416((uint)local_88.m.m[1][2]));
      fVar2 = auVar11._0_4_ + local_88.m.m[1][3];
      auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * local_88.m.m[3][1])),auVar9,
                                ZEXT416((uint)local_88.m.m[3][0]));
      auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * local_88.m.m[2][1])),auVar9,
                               ZEXT416((uint)local_88.m.m[2][0]));
      auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)auVar12._0_4_),
                                ZEXT416((uint)local_88.m.m[3][2]));
      auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)auVar12._0_4_),ZEXT416((uint)local_88.m.m[2][2])
                              );
      fVar7 = auVar11._0_4_ + local_88.m.m[3][3];
      fVar3 = auVar9._0_4_ + local_88.m.m[2][3];
      bVar1 = fVar7 == 1.0;
      auVar9 = vinsertps_avx(ZEXT416((uint)bVar1 * (int)fVar8 + (uint)!bVar1 * (int)(fVar8 / fVar7))
                             ,ZEXT416((uint)bVar1 * (int)fVar2 + (uint)!bVar1 * (int)(fVar2 / fVar7)
                                     ),0x10);
      PVar13.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar9._0_8_;
      PVar13.super_Tuple3<pbrt::Point3,_float>.z =
           (float)((uint)bVar1 * (int)fVar3 + (uint)!bVar1 * (int)(fVar3 / fVar7));
      return (Point3f)PVar13.super_Tuple3<pbrt::Point3,_float>;
    }
    auVar4 = vmovshdup_avx(auVar9);
    fVar8 = auVar4._0_4_;
    auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * (this->endTransform).m.m[3][1])),auVar9,
                             ZEXT416((uint)(this->endTransform).m.m[3][0]));
    auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * (this->endTransform).m.m[0][1])),auVar9,
                             ZEXT416((uint)(this->endTransform).m.m[0][0]));
    auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * (this->endTransform).m.m[1][1])),auVar9,
                             ZEXT416((uint)(this->endTransform).m.m[1][0]));
    auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * (this->endTransform).m.m[2][1])),auVar9,
                             ZEXT416((uint)(this->endTransform).m.m[2][0]));
    auVar4 = vfmadd231ss_fma(auVar4,auVar11,ZEXT416((uint)(this->endTransform).m.m[3][2]));
    auVar5 = vfmadd231ss_fma(auVar5,auVar11,ZEXT416((uint)(this->endTransform).m.m[0][2]));
    auVar6 = vfmadd231ss_fma(auVar6,auVar11,ZEXT416((uint)(this->endTransform).m.m[1][2]));
    auVar9 = vfmadd231ss_fma(auVar9,auVar11,ZEXT416((uint)(this->endTransform).m.m[2][2]));
    fVar8 = auVar4._0_4_ + (this->endTransform).m.m[3][3];
    fVar2 = auVar5._0_4_ + (this->endTransform).m.m[0][3];
    fVar7 = auVar6._0_4_ + (this->endTransform).m.m[1][3];
    fVar3 = auVar9._0_4_ + (this->endTransform).m.m[2][3];
  }
  bVar1 = fVar8 == 1.0;
  auVar9 = vinsertps_avx(ZEXT416((uint)bVar1 * (int)fVar2 + (uint)!bVar1 * (int)(fVar2 / fVar8)),
                         ZEXT416((uint)bVar1 * (int)fVar7 + (uint)!bVar1 * (int)(fVar7 / fVar8)),
                         0x10);
  PVar14.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar9._0_8_;
  PVar14.super_Tuple3<pbrt::Point3,_float>.z =
       (float)((uint)bVar1 * (int)fVar3 + (uint)!bVar1 * (int)(fVar3 / fVar8));
  return (Point3f)PVar14.super_Tuple3<pbrt::Point3,_float>;
}

Assistant:

Point3f AnimatedTransform::operator()(Point3f p, Float time) const {
    if (!actuallyAnimated || time <= startTime)
        return startTransform(p);
    else if (time >= endTime)
        return endTransform(p);
    Transform t = Interpolate(time);
    return t(p);
}